

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char sqlite3ExprAffinity(Expr *pExpr)

{
  byte bVar1;
  char cVar2;
  
  do {
    while( true ) {
      if ((pExpr->flags & 0x200) != 0) {
        return '\0';
      }
      for (; (pExpr->flags & 0x1000) != 0; pExpr = pExpr->pLeft) {
      }
      bVar1 = pExpr->op;
      if (bVar1 == 0xa8) break;
      if (bVar1 != 0x83) goto LAB_00196d58;
      pExpr = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
    }
    bVar1 = pExpr->op2;
LAB_00196d58:
    if (bVar1 < 0xa4) {
      if (bVar1 != 0xa2) {
        if (bVar1 == 0x24) {
          cVar2 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
          return cVar2;
        }
        goto LAB_00196dcf;
      }
LAB_00196d7d:
      if ((pExpr->y).pTab != (Table *)0x0) {
        if ((long)pExpr->iColumn < 0) {
          return 'D';
        }
        return ((pExpr->y).pTab)->aCol[pExpr->iColumn].affinity;
      }
    }
    else if (bVar1 == 0xa4) goto LAB_00196d7d;
    if (bVar1 != 0xaa) {
LAB_00196dcf:
      return pExpr->affinity;
    }
    pExpr = ((pExpr->pLeft->x).pSelect)->pEList->a[pExpr->iColumn].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(Expr *pExpr){
  int op;
  if( pExpr->flags & EP_Generic ) return 0;
  while( ExprHasProperty(pExpr, EP_Skip) ){
    assert( pExpr->op==TK_COLLATE );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_SELECT ){
    assert( pExpr->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
  if( op==TK_REGISTER ) op = pExpr->op2;
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( (op==TK_AGG_COLUMN || op==TK_COLUMN) && pExpr->y.pTab ){
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  return pExpr->affinity;
}